

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O1

void __thiscall
QVLABase<QList<QImage>_>::resize_impl
          (QVLABase<QList<QImage>_> *this,qsizetype prealloc,void *array,qsizetype sz)

{
  undefined8 *puVar1;
  void *pvVar2;
  long lVar3;
  
  lVar3 = (this->super_QVLABaseBase).a;
  if (lVar3 <= sz) {
    lVar3 = sz;
  }
  reallocate_impl(this,prealloc,array,sz,lVar3);
  lVar3 = (this->super_QVLABaseBase).s;
  while (lVar3 < sz) {
    pvVar2 = (this->super_QVLABaseBase).ptr;
    puVar1 = (undefined8 *)((long)pvVar2 + lVar3 * 0x18);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)pvVar2 + lVar3 * 0x18 + 0x10) = 0;
    lVar3 = (this->super_QVLABaseBase).s + 1;
    (this->super_QVLABaseBase).s = lVar3;
  }
  return;
}

Assistant:

void resize_impl(qsizetype prealloc, void *array, qsizetype sz)
    {
        reallocate_impl(prealloc, array, sz, qMax(sz, capacity()));
        if constexpr (QTypeInfo<T>::isComplex) {
            // call default constructor for new objects (which can throw)
            while (size() < sz) {
                q20::construct_at(data() + size());
                ++s;
            }
        } else {
            s = sz;
        }
    }